

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void trial::protocol::serialization::
     save_overloader<trial::protocol::bintoken::oarchive,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
     ::save(oarchive *ar,variable *data,uint protocol_version)

{
  writer *pwVar1;
  type_conflict1 data_00;
  type data_01;
  bool bVar2;
  type_conflict2 data_02;
  type_conflict3 data_03;
  value vVar3;
  type_conflict5 data_04;
  type_conflict4 data_05;
  type_conflict7 tVar4;
  const_reference pbVar5;
  type_conflict6 tVar6;
  size_type data_06;
  error *this;
  uint *__n;
  void *__buf;
  void *__buf_00;
  int __fd;
  type_conflict8 data_07;
  type_conflict9 data_08;
  basic_variable<std::allocator<char>_> key;
  pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  value;
  const_iterator it;
  basic_variable<std::allocator<char>_> val;
  variable *pvVar7;
  
  pvVar7 = data;
  vVar3 = dynamic::basic_variable<std::allocator<char>_>::code(data);
  __fd = (int)pvVar7;
  __n = &switchD_0010aa5c::switchdataD_00110050;
  switch(vVar3) {
  case null:
    bintoken::detail::basic_encoder<16UL>::overloader<trial::protocol::bintoken::token::null,_void>
    ::write((overloader<trial::protocol::bintoken::token::null,_void> *)&ar->writer,__fd,__buf,
            0x110050);
    return;
  case boolean:
    data_01 = dynamic::basic_variable<std::allocator<char>_>::value<bool>(data);
    bintoken::detail::basic_encoder<16UL>::value(&(ar->writer).encoder,data_01);
    return;
  case signed_char:
    data_00 = dynamic::basic_variable<std::allocator<char>_>::value<signed_char>(data);
    goto LAB_0010ab32;
  case unsigned_char:
    data_00 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>(data);
LAB_0010ab32:
    bintoken::detail::basic_encoder<16UL>::value(&(ar->writer).encoder,data_00);
    return;
  case signed_short_integer:
    data_02 = dynamic::basic_variable<std::allocator<char>_>::value<short>(data);
    bintoken::basic_writer<16UL>::overloader<short,_void>::value(&ar->writer,data_02);
    return;
  case unsigned_short_integer:
    data_03 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>(data);
    bintoken::basic_writer<16UL>::overloader<unsigned_short,_void>::value(&ar->writer,data_03);
    return;
  case signed_integer:
    data_05 = dynamic::basic_variable<std::allocator<char>_>::value<int>(data);
    bintoken::basic_writer<16UL>::overloader<int,_void>::value(&ar->writer,data_05);
    return;
  case unsigned_integer:
    data_04 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>(data);
    bintoken::basic_writer<16UL>::overloader<unsigned_int,_void>::value(&ar->writer,data_04);
    return;
  case signed_long_integer:
    tVar6 = dynamic::basic_variable<std::allocator<char>_>::value<long>(data);
    bintoken::basic_writer<16UL>::overloader<long,_void>::value(&ar->writer,tVar6);
    return;
  case unsigned_long_integer:
    tVar4 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>(data);
    bintoken::basic_writer<16UL>::overloader<unsigned_long,_void>::value(&ar->writer,tVar4);
    return;
  case signed_long_long_integer:
    tVar6 = dynamic::basic_variable<std::allocator<char>_>::value<long_long>(data);
    bintoken::basic_writer<16UL>::overloader<long_long,_void>::value(&ar->writer,tVar6);
    return;
  case unsigned_long_long_integer:
    tVar4 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>(data);
    bintoken::basic_writer<16UL>::overloader<unsigned_long_long,_void>::value(&ar->writer,tVar4);
    return;
  case float_number:
    data_07 = dynamic::basic_variable<std::allocator<char>_>::value<float>(data);
    bintoken::detail::basic_encoder<16UL>::value(&(ar->writer).encoder,(type)data_07);
    return;
  case double_number:
  case long_double_number:
    data_08 = dynamic::basic_variable<std::allocator<char>_>::value<double>(data);
    bintoken::detail::basic_encoder<16UL>::value(&(ar->writer).encoder,(type)data_08);
    return;
  case string:
    dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
              ((type *)&value,data);
    bintoken::basic_writer<16UL>::
    overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::value(&ar->writer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value)
    ;
    std::__cxx11::string::~string((string *)&value);
    break;
  case wstring:
  case u16string:
  case u32string:
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,incompatible_type);
    __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
  case array:
    pwVar1 = &ar->writer;
    bintoken::basic_writer<16UL>::overloader<trial::protocol::bintoken::token::begin_array,_void>::
    value(pwVar1);
    data_06 = dynamic::basic_variable<std::allocator<char>_>::size(data);
    bintoken::basic_writer<16UL>::overloader<unsigned_long,_void>::value(pwVar1,data_06);
    dynamic::basic_variable<std::allocator<char>_>::begin((const_iterator *)&value,data);
    dynamic::basic_variable<std::allocator<char>_>::end((const_iterator *)&key,data);
    while (bVar2 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                             ((const_iterator *)&value,(const_iterator *)&key), bVar2) {
      pbVar5 = dynamic::basic_variable<std::allocator<char>_>::
               iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ::value((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                        *)&value);
      save(ar,pbVar5,protocol_version);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)&value);
    }
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
                    *)((long)&key.storage.storage + 8));
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
                    *)((long)&value.first.storage.storage + 8));
    bintoken::basic_writer<16UL>::overloader<trial::protocol::bintoken::token::end_array,_void>::
    value(pwVar1);
    break;
  case map:
    pwVar1 = &ar->writer;
    bintoken::basic_writer<16UL>::
    overloader<trial::protocol::bintoken::token::begin_assoc_array,_void>::value(pwVar1);
    bintoken::detail::basic_encoder<16UL>::overloader<trial::protocol::bintoken::token::null,_void>
    ::write((overloader<trial::protocol::bintoken::token::null,_void> *)pwVar1,__fd,__buf_00,
            (size_t)__n);
    dynamic::basic_variable<std::allocator<char>_>::begin
              ((const_iterator *)
               &it.
                super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ,data);
    while( true ) {
      dynamic::basic_variable<std::allocator<char>_>::end((const_iterator *)&value,data);
      bVar2 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        ((const_iterator *)
                         &it.
                          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         ,(const_iterator *)&value);
      dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
                      *)((long)&value.first.storage.storage + 8));
      if (!bVar2) break;
      pbVar5 = dynamic::basic_variable<std::allocator<char>_>::
               iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ::key(&it.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    );
      dynamic::basic_variable<std::allocator<char>_>::basic_variable(&key,pbVar5);
      pbVar5 = dynamic::basic_variable<std::allocator<char>_>::
               iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ::value(&it.
                        super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      );
      dynamic::basic_variable<std::allocator<char>_>::basic_variable(&val,pbVar5);
      std::
      pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::
      pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_true>
                (&value,&key,&val);
      save(ar,&value.first,protocol_version);
      save(ar,&value.second,protocol_version);
      std::
      pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::~pair(&value);
      dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
      ::~small_union(&val.storage);
      dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
      ::~small_union(&key.storage);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++(&it.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
    }
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union(&it.
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    .current);
    bintoken::basic_writer<16UL>::
    overloader<trial::protocol::bintoken::token::end_assoc_array,_void>::value(pwVar1);
  }
  return;
}

Assistant:

static void save(protocol::bintoken::oarchive& ar,
                     const dynamic::variable& data,
                     const unsigned int protocol_version)
    {
        switch (data.code())
        {
        case dynamic::code::null:
            ar.template save<bintoken::token::null>();
            break;

        case dynamic::code::boolean:
            ar.save(data.value<bool>());
            break;

        case dynamic::code::signed_char:
            ar.save(data.value<signed char>());
            break;

        case dynamic::code::unsigned_char:
            ar.save(data.value<unsigned char>());
            break;

        case dynamic::code::signed_short_integer:
            ar.save(data.value<signed short int>());
            break;

        case dynamic::code::unsigned_short_integer:
            ar.save(data.value<unsigned short int>());
            break;

        case dynamic::code::signed_integer:
            ar.save(data.value<signed int>());
            break;

        case dynamic::code::unsigned_integer:
            ar.save(data.value<unsigned int>());
            break;

        case dynamic::code::signed_long_integer:
            ar.save(data.value<signed long int>());
            break;

        case dynamic::code::unsigned_long_integer:
            ar.save(data.value<unsigned long int>());
            break;

        case dynamic::code::signed_long_long_integer:
            ar.save(data.value<signed long long int>());
            break;

        case dynamic::code::unsigned_long_long_integer:
            ar.save(data.value<unsigned long long int>());
            break;

        case dynamic::code::real:
            ar.save(data.value<float>());
            break;

        case dynamic::code::long_real:
            ar.save(data.value<double>());
            break;

        case dynamic::code::long_long_real:
            // Format only supports 64-bit floats
            ar.save(data.value<double>());
            break;

        case dynamic::code::string:
            ar.save(data.value<dynamic::string>());
            break;

        case dynamic::code::wstring:
        case dynamic::code::u16string:
        case dynamic::code::u32string:
            throw bintoken::error(bintoken::incompatible_type);

        case dynamic::code::array:
            ar.template save<bintoken::token::begin_array>();
            ar.template save<std::size_t>(data.size());
            for (const auto& item : data)
            {
                ar.save_override(item, protocol_version);
            }
            ar.template save<bintoken::token::end_array>();
            break;

        case dynamic::code::map:
            ar.template save<bintoken::token::begin_assoc_array>();
            ar.template save<bintoken::token::null>();
            for (auto it = data.begin(); it != data.end(); ++it)
            {
                auto key = it.key();
                auto val = it.value();
                auto value = std::make_pair(std::move(key), std::move(val));
                ar.save_override(value.first, protocol_version);
                ar.save_override(value.second, protocol_version);
            }
            ar.template save<bintoken::token::end_assoc_array>();
            break;
        }
    }